

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

void ctemplate_htmlparser::in_state_value(statemachine_ctx *ctx,int start,char chr,int end)

{
  void *pvVar1;
  jsparser_ctx *ctx_00;
  char *__s;
  size_t sVar2;
  
  pvVar1 = ctx->user;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("html != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                  ,0x235,
                  "void ctemplate_htmlparser::in_state_value(statemachine_ctx *, int, char, int)");
  }
  *(int *)((long)pvVar1 + 0x20) = *(int *)((long)pvVar1 + 0x20) + 1;
  if (*(int *)((long)pvVar1 + 0x24) == 1) {
    __s = entityfilter_process(*(entityfilter_ctx **)((long)pvVar1 + 0x18),chr);
    ctx_00 = *(jsparser_ctx **)((long)pvVar1 + 0x10);
    sVar2 = strlen(__s);
    jsparser_parse(ctx_00,__s,(int)sVar2);
    return;
  }
  return;
}

Assistant:

static void in_state_value(statemachine_ctx *ctx, int start, char chr, int end)
{
  htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
  assert(html != NULL);

  html->value_index++;

  if (html->in_js == 1) {
    const char *output;
    output = entityfilter_process(html->entityfilter, chr);
    jsparser_parse_str(html->jsparser, output);
  }
}